

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O3

char * cinatra::detail::get_token_to_eol
                 (char *buf,char *buf_end,char **token,size_t *token_len,int *ret)

{
  long lVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  lVar1 = -(long)buf;
  pbVar3 = (byte *)buf;
  while (7 < (long)(buf_end + lVar1)) {
    bVar2 = *pbVar3;
    if (bVar2 - 0x7f < 0xffffffa1) {
LAB_00112c14:
      if ((bVar2 < 0x20) && (bVar2 != 9)) goto LAB_00112c4d;
      if (bVar2 == 0x7f) goto LAB_00112c8f;
      pbVar3 = pbVar3 + 1;
    }
    else {
      bVar2 = pbVar3[1];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 1;
        goto LAB_00112c14;
      }
      bVar2 = pbVar3[2];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 2;
        goto LAB_00112c14;
      }
      bVar2 = pbVar3[3];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 3;
        goto LAB_00112c14;
      }
      bVar2 = pbVar3[4];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 4;
        goto LAB_00112c14;
      }
      bVar2 = pbVar3[5];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 5;
        goto LAB_00112c14;
      }
      bVar2 = pbVar3[6];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 6;
        goto LAB_00112c14;
      }
      bVar2 = pbVar3[7];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 7;
        goto LAB_00112c14;
      }
      pbVar3 = pbVar3 + 8;
    }
    lVar1 = -(long)pbVar3;
  }
  for (; pbVar3 != (byte *)buf_end; pbVar3 = pbVar3 + 1) {
    bVar2 = *pbVar3;
    if (bVar2 - 0x7f < 0xffffffa1) {
      if ((bVar2 < 0x20) && (bVar2 != 9)) goto LAB_00112c4d;
      if (bVar2 == 0x7f) goto LAB_00112c8f;
    }
  }
LAB_00112c6d:
  *ret = -2;
  return (char *)0x0;
LAB_00112c4d:
  if (bVar2 == 0xd) {
    if (pbVar3 + 1 == (byte *)buf_end) goto LAB_00112c6d;
    if (pbVar3[1] == 10) {
      pbVar4 = pbVar3 + 2;
      *token_len = (long)pbVar3 - (long)buf;
      goto LAB_00112c69;
    }
  }
  else if (bVar2 == 10) {
    *token_len = (long)pbVar3 - (long)buf;
    pbVar4 = pbVar3 + 1;
LAB_00112c69:
    *token = buf;
    return (char *)pbVar4;
  }
LAB_00112c8f:
  *ret = -1;
  return (char *)0x0;
}

Assistant:

static const char *get_token_to_eol(const char *buf, const char *buf_end,
                                    const char **token, size_t *token_len,
                                    int *ret) {
  const char *token_start = buf;
#ifdef CINATRA_SSE
  static const char ranges1[] =
      "\0\010"
      /* allow HT */
      "\012\037"
      /* allow SP and up to but not including DEL */
      "\177\177"
      /* allow chars w. MSB set */
      ;
  int found;
  buf = findchar_fast(buf, buf_end, ranges1, sizeof(ranges1) - 1, &found);
  if (found)
    goto FOUND_CTL;
#elif defined(CINATRA_ARM_OPT)
  const size_t block_size = 2 * sizeof(uint8x16_t) - 1;
  const char *const end =
      (size_t)(buf_end - buf) >= block_size ? buf_end - block_size : buf;

  for (; buf < end; buf += 2 * sizeof(uint8x16_t)) {
    const uint8x16_t space = vmovq_n_u8('\040');
    const uint8x16_t threshold = vmovq_n_u8(0137u);
    const uint8x16_t v1 = vld1q_u8((const uint8_t *)buf);
    const uint8x16_t v2 = vld1q_u8((const uint8_t *)buf + sizeof(v1));
    uint8x16_t v3 = vsubq_u8(v1, space);
    uint8x16_t v4 = vsubq_u8(v2, space);

    v3 = vcgeq_u8(v3, threshold);
    v4 = vcgeq_u8(v4, threshold);
    v3 = vorrq_u8(v3, v4);
    /* Pack the comparison result into half a vector, i.e. 64 bits. */
    v3 = vpmaxq_u8(v3, v3);

    if (vgetq_lane_u64(vreinterpretq_u64_u8(v3), 0)) {
      const uint8x16_t del = vmovq_n_u8('\177');
      /* This mask makes it possible to pack the comparison results into half a
       * vector, which has the same size as uint64_t. */
      const uint8x16_t mask = vreinterpretq_u8_u32(vmovq_n_u32(0x40100401));
      const uint8x16_t tab = vmovq_n_u8('\011');

      v3 = vcltq_u8(v1, space);
      v4 = vcltq_u8(v2, space);
      v3 = vbicq_u8(v3, vceqq_u8(v1, tab));
      v4 = vbicq_u8(v4, vceqq_u8(v2, tab));
      v3 = vorrq_u8(v3, vceqq_u8(v1, del));
      v4 = vorrq_u8(v4, vceqq_u8(v2, del));
      /* After masking, four consecutive bytes in the results do not have the
       * same bits set. */
      v3 = vandq_u8(v3, mask);
      v4 = vandq_u8(v4, mask);
      /* Pack the comparison results into 128, and then 64 bits. */
      v3 = vpaddq_u8(v3, v4);
      v3 = vpaddq_u8(v3, v3);

      uint64_t offset = vgetq_lane_u64(vreinterpretq_u64_u8(v3), 0);

      if (offset) {
        __asm__("rbit %x0, %x0" : "+r"(offset));
        static_assert(sizeof(unsigned long long) == sizeof(uint64_t),
                      "Need the number of leading 0-bits in uint64_t.");
        /* offset uses 2 bits per byte of input. */
        buf += __builtin_clzll(offset) / 2;
        goto FOUND_CTL;
      }
    }
  }
#else
  /* find non-printable char within the next 8 bytes, this is the hottest code;
   * manually inlined */
  while (likely(buf_end - buf >= 8)) {
#define DOIT()                               \
  do {                                       \
    if (unlikely(!IS_PRINTABLE_ASCII(*buf))) \
      goto NonPrintable;                     \
    ++buf;                                   \
  } while (0)
    DOIT();
    DOIT();
    DOIT();
    DOIT();
    DOIT();
    DOIT();
    DOIT();
    DOIT();
#undef DOIT
    continue;
  NonPrintable:
    if ((likely((unsigned char)*buf < '\040') && likely(*buf != '\011')) ||
        unlikely(*buf == '\177')) {
      goto FOUND_CTL;
    }
    ++buf;
  }
#endif
  for (;; ++buf) {
    CHECK_EOF();
    if (unlikely(!IS_PRINTABLE_ASCII(*buf))) {
      if ((likely((unsigned char)*buf < '\040') && likely(*buf != '\011')) ||
          unlikely(*buf == '\177')) {
        goto FOUND_CTL;
      }
    }
  }
FOUND_CTL:
  if (likely(*buf == '\015')) {
    ++buf;
    EXPECT_CHAR('\012');
    *token_len = buf - 2 - token_start;
  }
  else if (*buf == '\012') {
    *token_len = buf - token_start;
    ++buf;
  }
  else {
    *ret = -1;
    return NULL;
  }
  *token = token_start;

  return buf;
}